

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing>::reallocateAndGrow
          (QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *old)

{
  long lVar1;
  bool bVar2;
  Changing *pCVar3;
  undefined8 uVar4;
  QGenericArrayOps<QAbstractItemModelTesterPrivate::Changing> *this_00;
  long in_RCX;
  long in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> dp;
  QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *in_stack_ffffffffffffff78;
  Changing *in_stack_ffffffffffffff80;
  Changing *in_stack_ffffffffffffff88;
  QGenericArrayOps<QAbstractItemModelTesterPrivate::Changing> *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  allocateGrow((QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *)&DAT_aaaaaaaaaaaaaaaa
               ,-0x5555555555555556,0xaaaaaaaa);
  if ((in_RDX < 1) ||
     (pCVar3 = data((QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *)
                    &stack0xffffffffffffffe0), pCVar3 != (Changing *)0x0)) {
    if (*(long *)(in_RDI + 0x10) != 0) {
      bVar2 = needsDetach((QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *)
                          in_stack_ffffffffffffff80);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<QAbstractItemModelTesterPrivate::Changing> *)
                  operator->((QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *)
                             &stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *)0x1aa671);
        begin((QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *)0x1aa680);
        QtPrivate::QGenericArrayOps<QAbstractItemModelTesterPrivate::Changing>::copyAppend
                  (this_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      }
      else {
        in_stack_ffffffffffffff80 =
             (Changing *)
             operator->((QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *)
                        &stack0xffffffffffffffe0);
        pCVar3 = begin((QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *)0x1aa6bf);
        begin((QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *)0x1aa6ce);
        QtPrivate::QGenericArrayOps<QAbstractItemModelTesterPrivate::Changing>::moveAppend
                  (in_stack_ffffffffffffff90,pCVar3,in_stack_ffffffffffffff80);
      }
    }
    swap((QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *)in_stack_ffffffffffffff80,
         in_stack_ffffffffffffff78);
    if (in_RCX != 0) {
      swap((QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *)in_stack_ffffffffffffff80
           ,in_stack_ffffffffffffff78);
    }
    ~QArrayDataPointer((QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *)
                       in_stack_ffffffffffffff80);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    uVar4 = qBadAlloc();
    ~QArrayDataPointer((QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *)
                       in_stack_ffffffffffffff80);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      _Unwind_Resume(uVar4);
    }
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }